

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

string * __thiscall adios2::Remote::GetKeyFromConnectionManager(Remote *this,string *keyID)

{
  string *psVar1;
  int iVar2;
  string *in_RDI;
  char *value;
  char *key;
  char *rest;
  char *token;
  char response [2048];
  string request;
  NetworkSocket socket;
  string *keyhex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff500;
  allocator *in_stack_fffffffffffff508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff548;
  string *in_stack_fffffffffffff550;
  string *in_stack_fffffffffffff558;
  string *component;
  allocator local_a71;
  string local_a70 [32];
  string local_a50 [39];
  allocator local_a29;
  string local_a28 [39];
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [39];
  allocator local_9b1;
  string local_9b0 [32];
  string local_990 [39];
  allocator local_969;
  string local_968 [16];
  size_t in_stack_fffffffffffff6a8;
  char *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  NetworkSocket *in_stack_fffffffffffff6c0;
  undefined1 local_919 [40];
  undefined1 local_8f1 [33];
  string *local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c8;
  undefined1 local_8b9;
  char *local_8b8;
  string *local_8b0;
  char local_8a8 [176];
  string *in_stack_fffffffffffff808;
  uint16_t in_stack_fffffffffffff816;
  string *in_stack_fffffffffffff818;
  NetworkSocket *in_stack_fffffffffffff820;
  string local_a0 [39];
  undefined1 local_79 [56];
  allocator local_41;
  string local_40 [64];
  
  helper::NetworkSocket::NetworkSocket((NetworkSocket *)in_stack_fffffffffffff500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"localhost",&local_41);
  component = (string *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_79 + 1),"tcp",(allocator *)component);
  helper::NetworkSocket::Connect
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff816,
             in_stack_fffffffffffff808);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::operator+((char *)in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  helper::NetworkSocket::RequestResponse
            (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
             in_stack_fffffffffffff6a8);
  local_8b8 = local_8a8;
  local_8b9 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  while (local_8b0 = (string *)strtok_r(local_8b8,",",&local_8b8), local_8b0 != (string *)0x0) {
    local_8d0 = local_8b0;
    local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                strtok_r((char *)local_8b0,":",(char **)&local_8d0);
    iVar2 = strncmp((char *)local_8c8,"port",4);
    if (iVar2 != 0) {
      iVar2 = strncmp((char *)local_8c8,"key",3);
      if (iVar2 == 0) {
        in_stack_fffffffffffff558 = (string *)local_8f1;
        in_stack_fffffffffffff550 = local_8d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_8f1 + 1),(char *)in_stack_fffffffffffff550,
                   (allocator *)in_stack_fffffffffffff558);
        std::__cxx11::string::operator=((string *)in_RDI,(string *)(local_8f1 + 1));
        std::__cxx11::string::~string((string *)(local_8f1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_8f1);
      }
      else {
        iVar2 = strncmp((char *)local_8c8,"msg",3);
        if (iVar2 == 0) {
          iVar2 = strcmp((char *)local_8d0,"no_error");
          if ((iVar2 != 0) && (iVar2 = strcmp((char *)local_8d0,"cannot_find_key_id"), iVar2 != 0))
          {
            in_stack_fffffffffffff548 = (string *)local_919;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_919 + 1),"Toolkit",(allocator *)in_stack_fffffffffffff548);
            in_stack_fffffffffffff540 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffff6bf;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffff6c0,"Remote",
                       (allocator *)in_stack_fffffffffffff540);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_968,"GetKey",&local_969);
            psVar1 = local_8d0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_9b0,(char *)psVar1,&local_9b1);
            std::operator+((char *)in_stack_fffffffffffff508,in_stack_fffffffffffff500);
            helper::Throw<std::invalid_argument>
                      (component,in_stack_fffffffffffff558,in_stack_fffffffffffff550,
                       in_stack_fffffffffffff548,(int)((ulong)in_stack_fffffffffffff540 >> 0x20));
            std::__cxx11::string::~string(local_990);
            std::__cxx11::string::~string(local_9b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
            std::__cxx11::string::~string(local_968);
            std::allocator<char>::~allocator((allocator<char> *)&local_969);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffff6c0);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff6bf);
            std::__cxx11::string::~string((string *)(local_919 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_919);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_9d8,"Toolkit",&local_9d9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a00,"Remote",&local_a01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a28,"EstablishConnection",&local_a29);
          in_stack_fffffffffffff508 = &local_a71;
          in_stack_fffffffffffff500 = local_8c8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a70,(char *)in_stack_fffffffffffff500,in_stack_fffffffffffff508);
          std::operator+((char *)in_stack_fffffffffffff508,in_stack_fffffffffffff500);
          helper::Throw<std::invalid_argument>
                    (component,in_stack_fffffffffffff558,in_stack_fffffffffffff550,
                     in_stack_fffffffffffff548,(int)((ulong)in_stack_fffffffffffff540 >> 0x20));
          std::__cxx11::string::~string(local_a50);
          std::__cxx11::string::~string(local_a70);
          std::allocator<char>::~allocator((allocator<char> *)&local_a71);
          std::__cxx11::string::~string(local_a28);
          std::allocator<char>::~allocator((allocator<char> *)&local_a29);
          std::__cxx11::string::~string(local_a00);
          std::allocator<char>::~allocator((allocator<char> *)&local_a01);
          std::__cxx11::string::~string(local_9d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
        }
      }
    }
  }
  helper::NetworkSocket::Close((NetworkSocket *)in_stack_fffffffffffff500);
  local_8b9 = 1;
  std::__cxx11::string::~string(local_a0);
  helper::NetworkSocket::~NetworkSocket((NetworkSocket *)in_stack_fffffffffffff500);
  return in_RDI;
}

Assistant:

std::string Remote::GetKeyFromConnectionManager(const std::string keyID)
{
    helper::NetworkSocket socket;
    socket.Connect("localhost", 30000);
    std::string request = "/get_key?id=" + keyID;

    char response[2048];
    socket.RequestResponse(request, response, 2048);

    // responses:
    //   "port:-1,msg:incomplete_service_definition
    //   "key:0,msg:missing_key_id_in_request"
    //   "key:0,msg:cannot_find_key_id"
    //   "key:5980a49cb5e0c4a6042f73f7ce0277d3a577e1af9cfc530e4f5683a615815d6a,msg:no_error"

    char *token;
    char *rest = response;

    std::string keyhex;

    // std::cout << "Response from Connection manager = \"" << response << "\"" << std::endl;
    while ((token = strtok_r(rest, ",", &rest)))
    {
        char *key;
        char *value = token;
        key = strtok_r(value, ":", &value);
        if (!strncmp(key, "port", 4))
        {
            ; // we don't care about port, msg will throw the error message
        }
        else if (!strncmp(key, "key", 3))
        {
            keyhex = std::string(value);
        }
        else if (!strncmp(key, "msg", 3))
        {
            if (strcmp(value, "no_error") && strcmp(value, "cannot_find_key_id"))
            {
                helper::Throw<std::invalid_argument>("Toolkit", "Remote", "GetKey",
                                                     "Error response from connection manager: " +
                                                         std::string(value));
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "Remote", "EstablishConnection",
                "Invalid response from connection manager. Do not understand key " +
                    std::string(key));
        }
    }

    socket.Close();
    return keyhex;
}